

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O1

TestCaseGroup * deqp::gles3::Functional::createLifetimeTests(Context *context)

{
  TestCaseGroup *this;
  
  this = (TestCaseGroup *)operator_new(0x88);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"lifetime","Object lifetime tests");
  this->m_context = context;
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestGroup_00d1dfe8
  ;
  this[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  return this;
}

Assistant:

TestCaseGroup* createLifetimeTests (Context& context)
{
	return new TestGroup(context);
}